

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPE.cc
# Opt level: O0

void __thiscall
onmt::BPE::recursive_split
          (BPE *this,Token *piece,vector<onmt::Token,_std::allocator<onmt::Token>_> *pieces_in_vocab
          ,bool first,bool last)

{
  byte bVar1;
  bool bVar2;
  pointer pvVar3;
  byte in_CL;
  byte bVar4;
  Token *in_RDX;
  BPE *in_RSI;
  long in_RDI;
  byte in_R8B;
  Token right_piece;
  Token left_piece;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator it;
  size_t right_offset;
  size_t left_offset;
  string bpe_surface;
  Token *in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  undefined5 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdad;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffdaf;
  undefined1 uVar6;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined5 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc5;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  _Alloc_hider _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Token local_220;
  string local_1d8 [14];
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  Token *in_stack_fffffffffffffe38;
  BPE *in_stack_fffffffffffffe40;
  string local_128 [72];
  byte local_e0;
  undefined1 local_df;
  byte local_dd;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  undefined4 local_b4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_a8;
  string local_a0 [48];
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  string local_40 [30];
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined6 in_stack_ffffffffffffffe0;
  BPE *this_01;
  
  bVar4 = in_CL & 1;
  bVar1 = in_R8B & 1;
  this_01 = in_RSI;
  std::__cxx11::string::string(local_40,(string *)in_RSI);
  local_48 = 0;
  local_50 = 0;
  if (((*(byte *)(in_RDI + 0x48) & 1) != 0) && ((bVar4 & 1) != 0)) {
    std::operator+(in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdc7,
                            CONCAT16(in_stack_fffffffffffffdc6,
                                     CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0)))
                  );
    std::__cxx11::string::operator=(local_40,local_70);
    std::__cxx11::string::~string(local_70);
    local_48 = std::__cxx11::string::size();
  }
  if (((*(byte *)(in_RDI + 0x49) & 1) != 0) && ((bVar1 & 1) != 0)) {
    std::operator+(in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdc7,
                            CONCAT16(in_stack_fffffffffffffdc6,
                                     CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0)))
                  );
    std::__cxx11::string::operator=(local_40,local_a0);
    std::__cxx11::string::~string(local_a0);
    local_50 = std::__cxx11::string::size();
  }
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd98,(key_type *)0x38b44a);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_fffffffffffffd98);
  bVar2 = std::__detail::operator==(&local_a8,&local_b0);
  if (bVar2) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (in_stack_fffffffffffffdb0,
               (Token *)CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,
                                          CONCAT15(in_stack_fffffffffffffdad,
                                                   in_stack_fffffffffffffda8))));
    local_b4 = 1;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
                           *)0x38b4c3);
    local_c0 = &pvVar3->second;
    std::__cxx11::string::substr((ulong)local_128,(ulong)local_c0);
    Token::Token(in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->surface);
    std::__cxx11::string::~string(local_128);
    _Var7 = (_Alloc_hider)0x0;
    if ((bVar4 & 1) != 0) {
      _Var7 = (in_RSI->_begin_of_word)._M_dataplus;
    }
    local_e0 = (byte)_Var7 & 1;
    local_df = 1;
    local_dd = 0;
    if (((bVar4 & 1) != 0) && (local_dd = 0, ((byte)(in_RSI->_begin_of_word)._M_dataplus & 1) != 0))
    {
      local_dd = (in_RSI->_begin_of_word).field_0x3;
    }
    local_dd = local_dd & 1;
    bVar2 = in_vocabulary(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (bool)in_stack_fffffffffffffe37,(bool)in_stack_fffffffffffffe36);
    if (bVar2) {
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                (in_stack_fffffffffffffdb0,
                 (Token *)CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,
                                            CONCAT15(in_stack_fffffffffffffdad,
                                                     in_stack_fffffffffffffda8))));
    }
    else {
      Token::Token(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      recursive_split(this_01,in_RDX,
                      (vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                      CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                      (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
      Token::~Token(in_stack_fffffffffffffda0);
    }
    Token::~Token(in_stack_fffffffffffffda0);
    this_00 = &local_c0->second;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_1d8,(ulong)this_00);
    Token::Token(in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->surface);
    std::__cxx11::string::~string(local_1d8);
    uVar6 = 1;
    if ((bVar1 & 1) != 0) {
      uVar6 = (in_RSI->_begin_of_word).field_0x1;
    }
    uVar5 = 0;
    if (((bVar1 & 1) != 0) && (uVar5 = 0, ((in_RSI->_begin_of_word).field_0x1 & 1) != 0)) {
      uVar5 = (in_RSI->_begin_of_word).field_0x3;
    }
    bVar2 = in_vocabulary(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (bool)in_stack_fffffffffffffe37,(bool)in_stack_fffffffffffffe36);
    if (bVar2) {
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)this_00,
                 (Token *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(bVar2,in_stack_fffffffffffffda8))))
      ;
    }
    else {
      in_stack_fffffffffffffda0 = &local_220;
      Token::Token(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      recursive_split(this_01,in_RDX,
                      (vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                      CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                      (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
      Token::~Token(in_stack_fffffffffffffda0);
    }
    Token::~Token(in_stack_fffffffffffffda0);
    local_b4 = 0;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void BPE::recursive_split(Token piece,
                            std::vector<Token>& pieces_in_vocab,
                            const bool first,
                            const bool last) const
  {
    // Recursively split segment into smaller units (by reversing BPE merges)
    // until all units are either in - vocabulary, or cannot be split further.
    std::string bpe_surface = piece.surface;
    size_t left_offset = 0;
    size_t right_offset = 0;
    if (_prefix && first)
    {
      bpe_surface = _begin_of_word + bpe_surface;
      left_offset = _begin_of_word.size();
    }
    if (_suffix && last)
    {
      bpe_surface = bpe_surface + _end_of_word;
      right_offset = _end_of_word.size();
    }

    auto it = _codes_reverse.find(bpe_surface);
    if (it == _codes_reverse.end())
    {
      pieces_in_vocab.emplace_back(std::move(piece));
      return;
    }

    const auto& pair = it->second;

    {
      Token left_piece(pair.first.substr(left_offset));
      left_piece.join_left = first && piece.join_left;
      left_piece.join_right = true;
      left_piece.preserve = first && piece.join_left && piece.preserve;

      if (in_vocabulary(left_piece, first, false))
        pieces_in_vocab.emplace_back(std::move(left_piece));
      else
        recursive_split(std::move(left_piece), pieces_in_vocab, first, false);
    }

    {
      Token right_piece(pair.second.substr(0, pair.second.size() - right_offset));
      right_piece.join_left = false;
      right_piece.join_right = !last || piece.join_right;
      right_piece.preserve = last && piece.join_right && piece.preserve;

      if (in_vocabulary(right_piece, false, last))
        pieces_in_vocab.emplace_back(std::move(right_piece));
      else
        recursive_split(std::move(right_piece), pieces_in_vocab, false, last);
    }
  }